

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testRunInfo)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  TestRunInfo *in_RSI;
  StreamingReporterBase *in_RDI;
  TestSpec *in_stack_ffffffffffffff88;
  ColourGuard *in_stack_ffffffffffffff90;
  ColourImpl *in_stack_ffffffffffffff98;
  
  StreamingReporterBase::testRunStarting(in_RDI,in_RSI);
  (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1a1019);
  if (bVar1) {
    Detail::unique_ptr<Catch::ColourImpl>::operator->(&(in_RDI->super_ReporterBase).m_colour);
    ColourImpl::guardColour
              (in_stack_ffffffffffffff98,(Code)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    poVar3 = Catch::operator<<((ostream *)in_stack_ffffffffffffff90,
                               (ColourGuard *)in_stack_ffffffffffffff88);
    std::operator<<(poVar3,"Filters: ");
    (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0xd])();
    poVar3 = Catch::operator<<((ostream *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::operator<<(poVar3,'\n');
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff90);
  }
  poVar3 = std::operator<<((in_RDI->super_ReporterBase).m_stream,"Randomness seeded to: ");
  uVar2 = getSeed();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testRunInfo) {
    StreamingReporterBase::testRunStarting(_testRunInfo);
    if ( m_config->testSpec().hasFilters() ) {
        m_stream << m_colour->guardColour( Colour::BrightYellow ) << "Filters: "
                 << m_config->testSpec() << '\n';
    }
    m_stream << "Randomness seeded to: " << getSeed() << '\n';
}